

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcReadSmt.c
# Opt level: O0

int Smt_PrsBuildNode(Wlc_Ntk_t *pNtk,Smt_Prs_t *p,int iNode,int RangeOut,char *pName)

{
  Abc_Nam_t *p_00;
  Smt_Prs_t *pSVar1;
  int iVar2;
  int iVar3;
  char *pStr_00;
  Wlc_Obj_t *pWVar4;
  int *piVar5;
  int t;
  int *pArray;
  char Buffer [100];
  Vec_Int_t *vFanins_1;
  int Type;
  int Value2;
  int Value1;
  int Range;
  int fSigned;
  int iFanin;
  int NameId;
  int Fan;
  int i;
  int iConst;
  int iOper;
  int iObj_1;
  Vec_Int_t *vFanins;
  char *pStr2;
  char *pStr1;
  char *pStr0;
  Vec_Int_t *vFans;
  int iObj;
  int fFound;
  char *pStr;
  char *pName_local;
  int RangeOut_local;
  int iNode_local;
  Smt_Prs_t *p_local;
  Wlc_Ntk_t *pNtk_local;
  
  pStr = pName;
  pName_local._0_4_ = RangeOut;
  pName_local._4_4_ = iNode;
  _RangeOut_local = p;
  p_local = (Smt_Prs_t *)pNtk;
  iVar2 = Smt_EntryIsName(iNode);
  if (iVar2 == 0) {
    pStr0 = (char *)Smt_EntryNode(_RangeOut_local,pName_local._4_4_);
    pStr1 = Smt_VecEntryName(_RangeOut_local,(Vec_Int_t *)pStr0,0);
    pStr2 = Smt_VecEntryName(_RangeOut_local,(Vec_Int_t *)pStr0,1);
    pSVar1 = _RangeOut_local;
    if ((((pStr1 == (char *)0x0) || (pStr2 == (char *)0x0)) || (*pStr1 != '_')) ||
       ((*pStr2 != 'b' || (pStr2[1] != 'v')))) {
      if ((pStr1 == (char *)0x0) || (*pStr1 != '=')) {
        Type = -1;
        vFanins_1._4_4_ = -1;
        iVar2 = Vec_IntEntry((Vec_Int_t *)pStr0,0);
        vFanins_1._0_4_ = Smt_PrsReadType(pSVar1,iVar2,&Value1,&Type,(int *)((long)&vFanins_1 + 4));
        register0x00000000 = Vec_IntAlloc(100);
        for (NameId = 1; iVar2 = NameId, iVar3 = Vec_IntSize((Vec_Int_t *)pStr0), iVar2 < iVar3;
            NameId = NameId + 1) {
          iFanin = Vec_IntEntry((Vec_Int_t *)pStr0,NameId);
          Range = Smt_PrsBuildNode((Wlc_Ntk_t *)p_local,_RangeOut_local,iFanin,-1,(char *)0x0);
          if (Range == 0) {
            Vec_IntFree(stack0xffffffffffffff60);
            return 0;
          }
          Vec_IntPush(stack0xffffffffffffff60,Range);
        }
        if (((int)vFanins_1 == 0x19) || ((int)vFanins_1 == 0x18)) {
          __assert_fail("Type != WLC_OBJ_BIT_SIGNEXT && Type != WLC_OBJ_BIT_ZEROPAD",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/wlc/wlcReadSmt.c"
                        ,0x2e5,"int Smt_PrsBuildNode(Wlc_Ntk_t *, Smt_Prs_t *, int, int, char *)");
        }
        if ((int)vFanins_1 == 0x16) {
          if (((Type < 0) || (vFanins_1._4_4_ < 0)) || (Type < vFanins_1._4_4_)) {
            __assert_fail("Value1 >= 0 && Value2 >= 0 && Value1 >= Value2",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/wlc/wlcReadSmt.c"
                          ,0x2e8,"int Smt_PrsBuildNode(Wlc_Ntk_t *, Smt_Prs_t *, int, int, char *)")
            ;
          }
          Vec_IntPushTwo(stack0xffffffffffffff60,Type,vFanins_1._4_4_);
        }
        else if (((int)vFanins_1 == 0xd) || ((int)vFanins_1 == 0xe)) {
          if (Type < 0) {
            __assert_fail("Value1 >= 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/wlc/wlcReadSmt.c"
                          ,0x2ee,"int Smt_PrsBuildNode(Wlc_Ntk_t *, Smt_Prs_t *, int, int, char *)")
            ;
          }
          sprintf((char *)&pArray,"%d",(ulong)(uint)Type);
          fSigned = Smt_PrsBuildConstant((Wlc_Ntk_t *)p_local,(char *)&pArray,-1,(char *)0x0);
          Vec_IntPush(stack0xffffffffffffff60,fSigned);
        }
        Value2 = 0;
        if (((int)vFanins_1 < 0x1a) || (0x27 < (int)vFanins_1)) {
          if ((int)vFanins_1 == 0x16) {
            Value2 = (Type - vFanins_1._4_4_) + 1;
          }
          else if ((int)vFanins_1 == 0x17) {
            for (NameId = 0; iVar2 = NameId, iVar3 = Vec_IntSize(stack0xffffffffffffff60),
                iVar2 < iVar3; NameId = NameId + 1) {
              fSigned = Vec_IntEntry(stack0xffffffffffffff60,NameId);
              pWVar4 = Wlc_NtkObj((Wlc_Ntk_t *)p_local,fSigned);
              iVar2 = Wlc_ObjRange(pWVar4);
              Value2 = iVar2 + Value2;
            }
          }
          else if ((int)vFanins_1 == 8) {
            piVar5 = Vec_IntArray(stack0xffffffffffffff60);
            iVar2 = Vec_IntSize(stack0xffffffffffffff60);
            if (iVar2 != 3) {
              __assert_fail("Vec_IntSize(vFanins) == 3",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/wlc/wlcReadSmt.c"
                            ,0x301,
                            "int Smt_PrsBuildNode(Wlc_Ntk_t *, Smt_Prs_t *, int, int, char *)");
            }
            iVar2 = piVar5[1];
            piVar5[1] = piVar5[2];
            piVar5[2] = iVar2;
            fSigned = Vec_IntEntry(stack0xffffffffffffff60,1);
            pWVar4 = Wlc_NtkObj((Wlc_Ntk_t *)p_local,fSigned);
            Value2 = Wlc_ObjRange(pWVar4);
          }
          else {
            fSigned = Vec_IntEntry(stack0xffffffffffffff60,0);
            pWVar4 = Wlc_NtkObj((Wlc_Ntk_t *)p_local,fSigned);
            Value2 = Wlc_ObjRange(pWVar4);
          }
        }
        else {
          Value2 = 1;
        }
        if (Value2 < 1) {
          __assert_fail("Range > 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/wlc/wlcReadSmt.c"
                        ,0x30c,"int Smt_PrsBuildNode(Wlc_Ntk_t *, Smt_Prs_t *, int, int, char *)");
        }
        fSigned = Smt_PrsCreateNode((Wlc_Ntk_t *)p_local,(int)vFanins_1,Value1,Value2,
                                    stack0xffffffffffffff60,pStr);
        Vec_IntFree(stack0xffffffffffffff60);
        pNtk_local._4_4_ = fSigned;
      }
      else {
        iVar2 = Vec_IntSize((Vec_Int_t *)pStr0);
        if (iVar2 != 3) {
          __assert_fail("Vec_IntSize(vFans) == 3",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/wlc/wlcReadSmt.c"
                        ,699,"int Smt_PrsBuildNode(Wlc_Ntk_t *, Smt_Prs_t *, int, int, char *)");
        }
        pName_local._4_4_ = Vec_IntEntry((Vec_Int_t *)pStr0,2);
        iVar2 = Smt_EntryIsName(pName_local._4_4_);
        if (iVar2 == 0) {
          __assert_fail("Smt_EntryIsName(iNode)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/wlc/wlcReadSmt.c"
                        ,0x2bd,"int Smt_PrsBuildNode(Wlc_Ntk_t *, Smt_Prs_t *, int, int, char *)");
        }
        pStr1 = Smt_EntryName(_RangeOut_local,pName_local._4_4_);
        iVar2 = strcmp("#b1",pStr1);
        if (iVar2 == 0) {
          pName_local._4_4_ = Vec_IntEntry((Vec_Int_t *)pStr0,1);
          pNtk_local._4_4_ =
               Smt_PrsBuildNode((Wlc_Ntk_t *)p_local,_RangeOut_local,pName_local._4_4_,-1,pStr);
        }
        else {
          _iOper = Vec_IntAlloc(2);
          Fan = Smt_PrsBuildConstant((Wlc_Ntk_t *)p_local,pStr1,-1,(char *)0x0);
          pName_local._4_4_ = Vec_IntEntry((Vec_Int_t *)pStr0,1);
          i = Smt_PrsBuildNode((Wlc_Ntk_t *)p_local,_RangeOut_local,pName_local._4_4_,-1,pStr);
          Vec_IntPushTwo(_iOper,i,Fan);
          iConst = Smt_PrsCreateNode((Wlc_Ntk_t *)p_local,0x1f,0,1,_iOper,pStr);
          Vec_IntFree(_iOper);
          pNtk_local._4_4_ = iConst;
        }
      }
    }
    else {
      vFanins = (Vec_Int_t *)Smt_VecEntryName(_RangeOut_local,(Vec_Int_t *)pStr0,2);
      iVar2 = Vec_IntSize((Vec_Int_t *)pStr0);
      pSVar1 = p_local;
      if (iVar2 != 3) {
        __assert_fail("Vec_IntSize(vFans) == 3",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/wlc/wlcReadSmt.c"
                      ,0x2b6,"int Smt_PrsBuildNode(Wlc_Ntk_t *, Smt_Prs_t *, int, int, char *)");
      }
      pStr_00 = pStr2 + 2;
      iVar2 = atoi((char *)vFanins);
      pNtk_local._4_4_ = Smt_PrsBuildConstant((Wlc_Ntk_t *)pSVar1,pStr_00,iVar2,pStr);
    }
  }
  else {
    p_00 = _RangeOut_local->pStrs;
    iVar2 = Abc_Lit2Var(pName_local._4_4_);
    _iObj = Abc_NamStr(p_00,iVar2);
    if (((*_iObj < '0') || ('9' < *_iObj)) && (*_iObj != '#')) {
      vFans._0_4_ = Abc_NamStrFindOrAdd(*(Abc_Nam_t **)(p_local->ErrorStr + 0x250),_iObj,
                                        (int *)((long)&vFans + 4));
      pNtk_local._4_4_ = (int)vFans;
      if (vFans._4_4_ == 0) {
        __assert_fail("fFound",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/wlc/wlcReadSmt.c"
                      ,0x2a9,"int Smt_PrsBuildNode(Wlc_Ntk_t *, Smt_Prs_t *, int, int, char *)");
      }
    }
    else {
      pNtk_local._4_4_ = Smt_PrsBuildConstant((Wlc_Ntk_t *)p_local,_iObj,(int)pName_local,pStr);
    }
  }
  return pNtk_local._4_4_;
}

Assistant:

int Smt_PrsBuildNode( Wlc_Ntk_t * pNtk, Smt_Prs_t * p, int iNode, int RangeOut, char * pName )
{
    if ( Smt_EntryIsName(iNode) ) // name or constant
    {
        char * pStr = Abc_NamStr(p->pStrs, Abc_Lit2Var(iNode));
        if ( (pStr[0] >= '0' && pStr[0] <= '9') || pStr[0] == '#' )
        { 
            // (_ BitVec 8) #x19
            return Smt_PrsBuildConstant( pNtk, pStr, RangeOut, pName );
        }
        else
        {
            // s3087
            int fFound, iObj = Abc_NamStrFindOrAdd( pNtk->pManName, pStr, &fFound );
            assert( fFound );
            return iObj;
        }
    }
    else // node
    {
        Vec_Int_t * vFans = Smt_EntryNode( p, iNode );
        char * pStr0 = Smt_VecEntryName( p, vFans, 0 );
        char * pStr1 = Smt_VecEntryName( p, vFans, 1 );
        if ( pStr0 && pStr1 && pStr0[0] == '_' && pStr1[0] == 'b' && pStr1[1] == 'v' )
        {
            // (_ bv1 32)
            char * pStr2 = Smt_VecEntryName( p, vFans, 2 );
            assert( Vec_IntSize(vFans) == 3 );
            return Smt_PrsBuildConstant( pNtk, pStr1+2, atoi(pStr2), pName );
        }
        else if ( pStr0 && pStr0[0] == '=' )
        {
            assert( Vec_IntSize(vFans) == 3 );
            iNode = Vec_IntEntry(vFans, 2);
            assert( Smt_EntryIsName(iNode) );
            pStr0 = Smt_EntryName(p, iNode);
            // check the last one is "#b1"
            if ( !strcmp("#b1", pStr0) )
            {
                iNode = Vec_IntEntry(vFans, 1);
                return Smt_PrsBuildNode( pNtk, p, iNode, -1, pName );
            }
            else
            {
                Vec_Int_t * vFanins = Vec_IntAlloc( 2 );
                // get the constant
                int iObj, iOper, iConst = Smt_PrsBuildConstant( pNtk, pStr0, -1, NULL );
                // check the middle one is an operator
                iNode = Vec_IntEntry(vFans, 1);
                iOper = Smt_PrsBuildNode( pNtk, p, iNode, -1, pName );
                // build comparator
                Vec_IntPushTwo( vFanins, iOper, iConst );
                iObj = Smt_PrsCreateNode( pNtk, WLC_OBJ_COMP_EQU, 0, 1, vFanins, pName );
                Vec_IntFree( vFanins );
                return iObj;
            }
        }
        else
        {
            int i, Fan, NameId, iFanin, fSigned, Range, Value1 = -1, Value2 = -1;
            int Type = Smt_PrsReadType( p, Vec_IntEntry(vFans, 0), &fSigned, &Value1, &Value2 );
            // collect fanins
            Vec_Int_t * vFanins = Vec_IntAlloc( 100 );
            Vec_IntForEachEntryStart( vFans, Fan, i, 1 )
            {
                iFanin = Smt_PrsBuildNode( pNtk, p, Fan, -1, NULL );
                if ( iFanin == 0 )
                {
                    Vec_IntFree( vFanins );
                    return 0;
                }
                Vec_IntPush( vFanins, iFanin );
            }
            // update specialized nodes
            assert( Type != WLC_OBJ_BIT_SIGNEXT && Type != WLC_OBJ_BIT_ZEROPAD );
            if ( Type == WLC_OBJ_BIT_SELECT )
            {
                assert( Value1 >= 0 && Value2 >= 0 && Value1 >= Value2 );
                Vec_IntPushTwo( vFanins, Value1, Value2 );
            }
            else if ( Type == WLC_OBJ_ROTATE_R || Type == WLC_OBJ_ROTATE_L )
            {
                char Buffer[100];
                assert( Value1 >= 0 );
                sprintf( Buffer, "%d", Value1 ); 
                NameId = Smt_PrsBuildConstant( pNtk, Buffer, -1, NULL );
                Vec_IntPush( vFanins, NameId );
            }
            // find range
            Range = 0;
            if ( Type >= WLC_OBJ_LOGIC_NOT && Type <= WLC_OBJ_REDUCT_XOR )
                Range = 1;
            else if ( Type == WLC_OBJ_BIT_SELECT )
                Range = Value1 - Value2 + 1;
            else if ( Type == WLC_OBJ_BIT_CONCAT )
            {
                Vec_IntForEachEntry( vFanins, NameId, i )
                    Range += Wlc_ObjRange( Wlc_NtkObj(pNtk, NameId) );
            }
            else if ( Type == WLC_OBJ_MUX )
            {
                int * pArray = Vec_IntArray(vFanins);
                assert( Vec_IntSize(vFanins) == 3 );
                ABC_SWAP( int, pArray[1], pArray[2] );
                NameId = Vec_IntEntry(vFanins, 1);
                Range = Wlc_ObjRange( Wlc_NtkObj(pNtk, NameId) );
            }
            else // to determine range, look at the first argument
            {
                NameId = Vec_IntEntry(vFanins, 0);
                Range = Wlc_ObjRange( Wlc_NtkObj(pNtk, NameId) );
            }
            // create node
            assert( Range > 0 );
            NameId = Smt_PrsCreateNode( pNtk, Type, fSigned, Range, vFanins, pName );
            Vec_IntFree( vFanins );
            return NameId;
        }
    }
}